

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::UninterpretedOption::ByteSizeLong(UninterpretedOption *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this_00;
  reference value;
  uint32_t *puVar4;
  string *psVar5;
  size_t sVar6;
  uint64_t value_00;
  int64_t value_01;
  UninterpretedOption_NamePart *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  UninterpretedOption *this_;
  UninterpretedOption *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_name_size(this);
  sStack_58 = (size_t)iVar3;
  this_00 = _internal_name(this);
  __end3 = RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::begin(this_00);
  msg = (UninterpretedOption_NamePart *)
        RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::end(this_00);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption_NamePart>::
            operator*(&__end3);
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption_NamePart>
                      (value);
    sStack_58 = sVar6 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption_NamePart>::operator++
              (&__end3);
  }
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  sStack_58 = (long)(int)((uint)((uVar1 & 0x20) != 0) * 9) + sStack_58;
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar5 = _internal_identifier_value_abi_cxx11_(this);
      sVar6 = internal::WireFormatLite::StringSize(psVar5);
      sStack_58 = sVar6 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      psVar5 = _internal_string_value_abi_cxx11_(this);
      sVar6 = internal::WireFormatLite::BytesSize(psVar5);
      sStack_58 = sVar6 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      psVar5 = _internal_aggregate_value_abi_cxx11_(this);
      sVar6 = internal::WireFormatLite::StringSize(psVar5);
      sStack_58 = sVar6 + 1 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      value_00 = _internal_positive_int_value(this);
      sVar6 = internal::WireFormatLite::UInt64SizePlusOne(value_00);
      sStack_58 = sVar6 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      value_01 = _internal_negative_int_value(this);
      sVar6 = internal::WireFormatLite::Int64SizePlusOne(value_01);
      sStack_58 = sVar6 + sStack_58;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t UninterpretedOption::ByteSizeLong() const {
  const UninterpretedOption& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
    {
      total_size += 1UL * this_._internal_name_size();
      for (const auto& msg : this_._internal_name()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000020u & cached_has_bits) * 9;
  if ((cached_has_bits & 0x0000001fu) != 0) {
    // optional string identifier_value = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_identifier_value());
    }
    // optional bytes string_value = 7;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_string_value());
    }
    // optional string aggregate_value = 8;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_aggregate_value());
    }
    // optional uint64 positive_int_value = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_positive_int_value());
    }
    // optional int64 negative_int_value = 5;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_negative_int_value());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}